

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O3

void makeMappings(vector<int,_std::allocator<int>_> *mapping,string *mapstring)

{
  pointer pcVar1;
  pointer piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  string newmap;
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  pcVar1 = (mapstring->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + mapstring->_M_string_length);
  uVar12 = 0;
  std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
  uVar6 = (uint)local_38;
  if ((int)uVar6 < 1) {
LAB_0011dc81:
    if ((int)uVar12 < (int)uVar6) {
      piVar2 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar7 = local_40 + (uVar12 & 0xffffffff);
      bVar3 = true;
      iVar9 = 0;
      uVar10 = 0;
      bVar5 = false;
      do {
        uVar8 = (int)*pcVar7 - 0x30;
        if (uVar8 < 10) {
          if (bVar3) {
            uVar10 = uVar8 + uVar10 * 10;
            bVar5 = false;
          }
          else {
            iVar9 = uVar8 + iVar9 * 10;
            bVar5 = false;
            bVar3 = false;
          }
        }
        else {
          bVar4 = !bVar3;
          if (bVar5) {
            bVar4 = bVar3;
          }
          if (bVar4) {
            if (0x7e < (int)uVar10) {
              uVar10 = 0x7f;
            }
            uVar11 = (ulong)uVar10;
            if ((int)uVar10 < 1) {
              uVar11 = 0;
            }
            if (0x7e < iVar9) {
              iVar9 = 0x7f;
            }
            if (iVar9 < 1) {
              iVar9 = 0;
            }
            piVar2[uVar11] = iVar9;
            bVar5 = true;
            bVar3 = true;
            uVar10 = 0;
            iVar9 = 0;
          }
          else {
            bVar3 = false;
            bVar5 = true;
          }
        }
        pcVar7 = pcVar7 + 1;
        uVar8 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar8;
      } while ((int)uVar8 < (int)uVar6);
    }
  }
  else {
    uVar12 = 0;
    do {
      if ((int)(char)local_40[uVar12] - 0x30U < 10) goto LAB_0011dc81;
      uVar12 = uVar12 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar12);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void makeMappings(vector<int>& mapping, const string& mapstring) {
   string newmap = mapstring + ' ';
   int ltx = 0;
   int d = 1;
   int digit1 = 0;
   int digit2 = 0;
   int ii;
   for (ii=0; ii<(int)newmap.size(); ii++) {
      if (isdigit(newmap[ii])) {
         break;
      }
   }
   for (int i=ii; i<(int)newmap.size(); i++) {
      if (isdigit(newmap[i])) {
        if (d) {
          digit1 = digit1 * 10 + (newmap[i] - '0');
        } else {
          digit2 = digit2 * 10 + (newmap[i] - '0');
        }
        ltx = 0;
      } else {
         if (!ltx) {
            d = !d;
         }
         ltx = 1;
         if (d) {
            digit1 = digit1 > 127 ? 127 : digit1;
            digit1 = digit1 <   0 ?   0 : digit1;
            digit2 = digit2 > 127 ? 127 : digit2;
            digit2 = digit2 <   0 ?   0 : digit2;
            mapping[digit1] = digit2;
            digit1 = 0;
            digit2 = 0;
         }
      }
   }
}